

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

_Bool Curl_meets_timecondition(Curl_easy *data,time_t timeofdoc)

{
  curl_TimeCond cVar1;
  time_t timeofdoc_local;
  Curl_easy *data_local;
  
  if ((timeofdoc != 0) && ((data->set).timevalue != 0)) {
    cVar1 = (data->set).timecondition;
    if ((cVar1 == CURL_TIMECOND_IFMODSINCE) || (cVar1 != CURL_TIMECOND_IFUNMODSINCE)) {
      if (timeofdoc <= (data->set).timevalue) {
        Curl_infof(data,"The requested document is not new enough\n");
        (data->info).timecond = true;
        return false;
      }
    }
    else if ((data->set).timevalue <= timeofdoc) {
      Curl_infof(data,"The requested document is not old enough\n");
      (data->info).timecond = true;
      return false;
    }
  }
  return true;
}

Assistant:

bool Curl_meets_timecondition(struct Curl_easy *data, time_t timeofdoc)
{
  if((timeofdoc == 0) || (data->set.timevalue == 0))
    return TRUE;

  switch(data->set.timecondition) {
  case CURL_TIMECOND_IFMODSINCE:
  default:
    if(timeofdoc <= data->set.timevalue) {
      infof(data,
            "The requested document is not new enough\n");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    if(timeofdoc >= data->set.timevalue) {
      infof(data,
            "The requested document is not old enough\n");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  }

  return TRUE;
}